

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O0

void __thiscall ON_Sun::CImpl::SetNorth(CImpl *this,double north)

{
  double a;
  ON_3dVector model_east;
  ON_3dVector model_north;
  bool bVar1;
  ON_3dVector *pOVar2;
  wchar_t *pwVar3;
  ON_XMLVariant local_1f0;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined1 local_b0 [8];
  ON_3dVector true_north;
  ON_Plane plane;
  double north_local;
  CImpl *this_local;
  
  plane.plane_equation.d = north;
  if (this->_earth_anchor_point == (ON_EarthAnchorPoint *)0x0) {
    pwVar3 = XMLPath_Sun();
    ::ON_XMLVariant::ON_XMLVariant(&local_1f0,plane.plane_equation.d);
    ON_InternalXMLImpl::SetParameter(&this->super_ON_InternalXMLImpl,pwVar3,L"north",&local_1f0);
    ::ON_XMLVariant::~ON_XMLVariant(&local_1f0);
    goto LAB_0092d307;
  }
  ON_Plane::ON_Plane((ON_Plane *)&true_north.z);
  GetEarthAnchorPlane(this,(ON_3dVector *)local_b0,(ON_Plane *)&true_north.z);
  a = ON_RadiansFromDegrees(plane.plane_equation.d + -90.0);
  ON_Plane::Rotate((ON_Plane *)&true_north.z,a,(ON_3dVector *)&plane.yaxis.z,
                   (ON_3dPoint *)&true_north.z);
  pOVar2 = ON_EarthAnchorPoint::ModelEast(this->_earth_anchor_point);
  bVar1 = IsVectorEqual(pOVar2,(ON_3dVector *)&plane.origin.z);
  if (bVar1) {
    pOVar2 = ON_EarthAnchorPoint::ModelNorth(this->_earth_anchor_point);
    bVar1 = IsVectorEqual(pOVar2,(ON_3dVector *)&plane.xaxis.z);
    if (!bVar1) goto LAB_0092d1b5;
  }
  else {
LAB_0092d1b5:
    local_c8 = plane.xaxis.y;
    local_d8 = plane.origin.z;
    dStack_d0 = plane.xaxis.x;
    model_east.y = plane.xaxis.x;
    model_east.x = plane.origin.z;
    model_east.z = plane.xaxis.y;
    ON_EarthAnchorPoint::SetModelEast(this->_earth_anchor_point,model_east);
    local_e8 = plane.yaxis.y;
    local_f8 = plane.xaxis.z;
    dStack_f0 = plane.yaxis.x;
    model_north.y = plane.yaxis.x;
    model_north.x = plane.xaxis.z;
    model_north.z = plane.yaxis.y;
    ON_EarthAnchorPoint::SetModelNorth(this->_earth_anchor_point,model_north);
  }
  pwVar3 = XMLPath_Sun();
  ON_InternalXMLImpl::RemoveParameter(&this->super_ON_InternalXMLImpl,pwVar3,L"north");
  ON_Plane::~ON_Plane((ON_Plane *)&true_north.z);
LAB_0092d307:
  this->_calc_dirty = true;
  return;
}

Assistant:

void ON_Sun::CImpl::SetNorth(double north)
{
  if (nullptr != _earth_anchor_point)
  {
    // Store the north in the earth anchor point. This is more complicated than just setting one value.
    ON_Plane plane;
    ON_3dVector true_north;
    GetEarthAnchorPlane(true_north, plane);

    // 29 January 2013 - Kike: Don't use ON_Plane::Rotate without origin.
    // This function doesn't keep the vector length if the axis is the plane's z axis.
    plane.Rotate(ON_RadiansFromDegrees(north - 90.0), plane.zaxis, plane.origin);

    if (!IsVectorEqual(_earth_anchor_point->ModelEast(),  plane.xaxis) ||
        !IsVectorEqual(_earth_anchor_point->ModelNorth(), plane.yaxis))
    {
      _earth_anchor_point->SetModelEast (plane.xaxis);
      _earth_anchor_point->SetModelNorth(plane.yaxis);
    }

    // Make sure this value never appears in the XML. This will clean old documents that were
    // incorrectly saving this value in the XML as well as the earth anchor point.
    RemoveParameter(XMLPath_Sun(), ON_RDK_SUN_NORTH);
  }
  else
  {
    // No earth anchor point is set; store the value in the XML.
    SetParameter(XMLPath_Sun(), ON_RDK_SUN_NORTH, north);
  }

  _calc_dirty = true;
}